

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitArrayGet(PrintExpressionContents *this,ArrayGet *curr)

{
  bool bVar1;
  HeapType type;
  long lVar2;
  char *pcVar3;
  ostream *stream;
  HeapType local_40;
  int local_38;
  uintptr_t local_30;
  
  local_30 = (uintptr_t)wasm::Type::getHeapType(&curr->ref->type);
  HeapType::getArray(&local_40);
  if ((local_40.id == 2) && (local_38 != 0)) {
    bVar1 = curr->signed_;
    stream = this->o;
    Colors::outputColorCode(stream,"\x1b[35m");
    Colors::outputColorCode(stream,"\x1b[1m");
    if (bVar1 == true) {
      pcVar3 = "array.get_s ";
    }
    else {
      pcVar3 = "array.get_u ";
    }
    lVar2 = 0xc;
  }
  else {
    stream = this->o;
    Colors::outputColorCode(stream,"\x1b[35m");
    Colors::outputColorCode(stream,"\x1b[1m");
    pcVar3 = "array.get ";
    lVar2 = 10;
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar3,lVar2);
  Colors::outputColorCode(stream,"\x1b[0m");
  type = wasm::Type::getHeapType(&curr->ref->type);
  PrintSExpression::printHeapTypeName(this->parent,type);
  return;
}

Assistant:

void visitArrayGet(ArrayGet* curr) {
    const auto& element = curr->ref->type.getHeapType().getArray().element;
    if (element.type == Type::i32 && element.packedType != Field::not_packed) {
      if (curr->signed_) {
        printMedium(o, "array.get_s ");
      } else {
        printMedium(o, "array.get_u ");
      }
    } else {
      printMedium(o, "array.get ");
    }
    printHeapTypeName(curr->ref->type.getHeapType());
  }